

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O2

bool __thiscall sznet::net::Poller::hasChannel(Poller *this,Channel *channel)

{
  const_iterator cVar1;
  bool bVar2;
  sz_fd local_1c;
  
  assertInLoopThread(this);
  local_1c = channel->m_fd;
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_sznet::net::Channel_*>,_std::_Select1st<std::pair<const_int,_sznet::net::Channel_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
          ::find(&(this->m_channels)._M_t,&local_1c);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->m_channels)._M_t._M_impl.super__Rb_tree_header) {
    bVar2 = false;
  }
  else {
    bVar2 = (Channel *)cVar1._M_node[1]._M_parent == channel;
  }
  return bVar2;
}

Assistant:

bool Poller::hasChannel(Channel* channel) const
{
	assertInLoopThread();
	ChannelMap::const_iterator it = m_channels.find(channel->fd());
	return it != m_channels.end() && it->second == channel;
}